

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O0

void ApprovalTests::FileUtils::ensureFileExists(string *fullFilePath)

{
  bool bVar1;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffffd0;
  string local_28 [32];
  string *local_8;
  
  local_8 = in_RDI;
  bVar1 = fileExists(fullFilePath);
  if (!bVar1) {
    ::std::__cxx11::string::string(local_28,local_8);
    ::std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    ::std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

void FileUtils::ensureFileExists(const std::string& fullFilePath)
    {
        if (!fileExists(fullFilePath))
        {
            EmptyFileCreatorFactory::currentCreator(fullFilePath);
        }
    }